

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_variantSetSpecStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                   *vslist,uint32_t indent)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  iterator iVar4;
  uint32_t uVar5;
  _Base_ptr in_RCX;
  uint32_t n;
  uint32_t extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar6;
  long extraout_RDX_01;
  _Rb_tree_node_base *p_Var7;
  const_iterator __begin4;
  _Base_ptr this;
  size_t i_1;
  _Base_ptr p_Var8;
  size_t i;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  token nameTok;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  stringstream ss;
  allocator local_261;
  uint local_260;
  uint local_25c;
  _Rb_tree_node_base *local_258;
  string *local_250;
  ulong local_248;
  _Rb_tree_node_base *local_240;
  _Rb_tree_node_base *local_238;
  _Rb_tree_node_base *local_230;
  string local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar9 = (ulong)indent;
  local_250 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  auVar11._8_8_ = extraout_RDX;
  auVar11._0_8_ = *(undefined8 *)(vslist + 0x18);
  local_240 = (_Rb_tree_node_base *)(vslist + 8);
  local_25c = indent + 1;
  local_260 = indent + 2;
  local_248 = uVar9;
  while (psVar1 = local_250, p_Var7 = auVar11._0_8_, p_Var7 != local_240) {
    if (p_Var7[4]._M_parent != (_Base_ptr)0x0) {
      local_258 = p_Var7 + 1;
      pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(uVar9 & 0xffffffff),auVar11._8_4_);
      poVar3 = std::operator<<(local_1a8,(string *)local_208);
      poVar3 = std::operator<<(poVar3,"variantSet ");
      std::__cxx11::string::string((string *)&local_1d8,"\"",&local_261);
      quote(&local_228,(string *)local_258,&local_1d8);
      poVar3 = std::operator<<(poVar3,(string *)&local_228);
      std::operator<<(poVar3," = {\n");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      auVar10._8_8_ = extraout_RDX_00;
      auVar10._0_8_ = p_Var7[3]._M_right;
      local_230 = (_Rb_tree_node_base *)&p_Var7[3]._M_parent;
      local_238 = p_Var7;
      while( true ) {
        uVar9 = local_248;
        p_Var7 = auVar10._0_8_;
        uVar5 = (uint32_t)in_RCX;
        if (p_Var7 == local_230) break;
        local_258 = p_Var7 + 1;
        pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(ulong)local_25c,auVar10._8_4_);
        poVar3 = std::operator<<(local_1a8,(string *)local_208);
        std::__cxx11::string::string((string *)&local_1d8,"\"",&local_261);
        quote(&local_228,(string *)local_258,&local_1d8);
        poVar3 = std::operator<<(poVar3,(string *)&local_228);
        std::operator<<(poVar3," ");
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        bVar2 = PrimMetas::authored((PrimMetas *)&p_Var7[0xb]._M_right);
        if (bVar2) {
          std::operator<<(local_1a8,"(\n");
          print_prim_metas_abi_cxx11_
                    ((string *)local_208,(tinyusdz *)&p_Var7[0xb]._M_right,
                     (PrimMeta *)(ulong)local_260,uVar5);
          std::operator<<(local_1a8,(string *)local_208);
          std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(ulong)local_25c,n);
          poVar3 = std::operator<<(local_1a8,(string *)local_208);
          std::operator<<(poVar3,") ");
          std::__cxx11::string::_M_dispose();
        }
        std::operator<<(local_1a8,"{\n");
        print_props((string *)local_208,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)(p_Var7 + 5),local_260);
        std::operator<<(local_1a8,(string *)local_208);
        std::__cxx11::string::_M_dispose();
        in_RCX = (_Base_ptr)(*(long *)(p_Var7 + 0x27) - (long)p_Var7[0x26]._M_right >> 5);
        this = p_Var7[4]._M_parent;
        p_Var8 = p_Var7[4]._M_left;
        lVar6 = ((long)p_Var8 - (long)this) % 0x568;
        if (in_RCX == (_Base_ptr)(((long)p_Var8 - (long)this) / 0x568)) {
          local_208._8_4_ = 0;
          local_1f8._M_allocated_capacity = 0;
          local_1f8._8_8_ = local_208 + 8;
          local_1e0 = 0;
          lVar6 = 0;
          local_1e8 = (undefined1 *)local_1f8._8_8_;
          for (uVar9 = 0; in_RCX = (_Base_ptr)0x568,
              uVar9 < (ulong)(((long)p_Var8 - (long)this) / 0x568); uVar9 = uVar9 + 1) {
            local_228._M_dataplus._M_p = (pointer)((long)&this->_M_color + lVar6);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                        *)local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&this[1]._M_parent + lVar6),(PrimSpec **)&local_228);
            this = p_Var7[4]._M_parent;
            p_Var8 = p_Var7[4]._M_left;
            lVar6 = lVar6 + 0x568;
          }
          lVar6 = 0;
          for (uVar9 = 0;
              uVar9 < (ulong)(*(long *)(p_Var7 + 0x27) - (long)p_Var7[0x26]._M_right >> 5);
              uVar9 = uVar9 + 1) {
            std::__cxx11::string::string
                      ((string *)&local_228,
                       (string *)((long)&(p_Var7[0x26]._M_right)->_M_color + lVar6));
            iVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                            *)local_208,&local_228);
            in_RCX = (_Base_ptr)(local_208 + 8);
            if (iVar4._M_node != in_RCX) {
              prim::print_primspec_abi_cxx11_
                        (&local_1d8,*(prim **)(iVar4._M_node + 2),(PrimSpec *)(ulong)local_260,
                         (uint32_t)in_RCX);
              std::operator<<(local_1a8,(string *)&local_1d8);
              std::__cxx11::string::_M_dispose();
            }
            std::__cxx11::string::_M_dispose();
            lVar6 = lVar6 + 0x20;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                       *)local_208);
          uVar5 = extraout_EDX;
        }
        else {
          for (; uVar5 = (uint32_t)lVar6, this != p_Var8; this = (_Base_ptr)&this[0x2b]._M_parent) {
            prim::print_primspec_abi_cxx11_
                      ((string *)local_208,(prim *)this,(PrimSpec *)(ulong)local_260,
                       (uint32_t)in_RCX);
            std::operator<<(local_1a8,(string *)local_208);
            std::__cxx11::string::_M_dispose();
            lVar6 = extraout_RDX_01;
          }
        }
        pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(ulong)local_25c,uVar5);
        poVar3 = std::operator<<(local_1a8,(string *)local_208);
        std::operator<<(poVar3,"}\n");
        std::__cxx11::string::_M_dispose();
        auVar10 = std::_Rb_tree_increment(p_Var7);
      }
      pprint::Indent_abi_cxx11_
                ((string *)local_208,(pprint *)(local_248 & 0xffffffff),auVar10._8_4_);
      poVar3 = std::operator<<(local_1a8,(string *)local_208);
      std::operator<<(poVar3,"}\n");
      std::__cxx11::string::_M_dispose();
      p_Var7 = local_238;
    }
    auVar11 = std::_Rb_tree_increment(p_Var7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string print_variantSetSpecStmt(
    const std::map<std::string, VariantSetSpec> &vslist,
    const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.props(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.children();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const PrimSpec *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << prim::print_primspec(*(it->second), indent + 2);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << prim::print_primspec(child, indent + 2);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}